

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxDotCross::Emit(FxDotCross *this,VMFunctionBuilder *build)

{
  byte bVar1;
  byte bVar2;
  PType *pPVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExpEmit EVar7;
  int opcode;
  
  pPVar3 = (this->super_FxExpression).ValueType;
  bVar1 = pPVar3->RegType;
  bVar2 = pPVar3->RegCount;
  uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers + bVar1,(uint)bVar2);
  uVar5 = (*this->left->_vptr_FxExpression[9])(this->left,build);
  uVar6 = (*this->right->_vptr_FxExpression[9])(this->right,build);
  opcode = 0xc4;
  if (this->Operator != 0x167) {
    opcode = 0xb8;
    if ((PStruct *)this->left->ValueType == TypeVector3) {
      opcode = 0xc3;
    }
  }
  VMFunctionBuilder::Emit(build,opcode,uVar4 & 0xffff,uVar5 & 0xffff,uVar6 & 0xffff);
  if ((CONCAT44(extraout_var,uVar5) & 0x10100fc0000) == 0) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + ((uint)(CONCAT44(extraout_var,uVar5) >> 0x10) & 3),uVar5 & 0xffff,
               uVar5 >> 0x18);
  }
  if ((CONCAT44(extraout_var_00,uVar6) & 0x10100fc0000) == 0) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + ((uint)(CONCAT44(extraout_var_00,uVar6) >> 0x10) & 3),
               uVar6 & 0xffff,uVar6 >> 0x18);
  }
  EVar7._0_4_ = uVar4 & 0xffff | (uint)bVar1 << 0x10 | (uint)bVar2 << 0x18;
  EVar7.Konst = false;
  EVar7.Fixed = false;
  EVar7.Final = false;
  EVar7.Target = false;
  return EVar7;
}

Assistant:

ExpEmit FxDotCross::Emit(VMFunctionBuilder *build)
{
	ExpEmit to(build, ValueType->GetRegType(), ValueType->GetRegCount());
	ExpEmit op1 = left->Emit(build);
	ExpEmit op2 = right->Emit(build);
	int op = Operator == TK_Cross ? OP_CROSSV_RR : left->ValueType == TypeVector3 ? OP_DOTV3_RR : OP_DOTV2_RR;
	build->Emit(op, to.RegNum, op1.RegNum, op2.RegNum);
	op1.Free(build);
	op2.Free(build);
	return to;
}